

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int read_header(archive_read *a,archive_entry *entry,char head_type)

{
  int64_t *piVar1;
  long lVar2;
  int64_t *piVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  short sVar9;
  uint uVar10;
  rar *rar;
  short *psVar11;
  uint uVar12;
  uint uVar13;
  short sVar14;
  undefined4 uVar15;
  int iVar16;
  wchar_t wVar17;
  int iVar18;
  archive_string_conv *paVar19;
  short *psVar20;
  uint *puVar21;
  time_t tVar22;
  ulong uVar23;
  void *pvVar24;
  char *pcVar25;
  size_t sVar26;
  archive_string_conv *paVar27;
  data_block_offsets *pdVar28;
  archive_string_conv *paVar29;
  int *piVar30;
  byte bVar31;
  uint uVar32;
  mode_t mVar33;
  char *pcVar34;
  char cVar35;
  size_t __n;
  uint uVar36;
  size_t sVar37;
  long lVar38;
  byte bVar39;
  char cVar40;
  uint uVar41;
  uint uVar42;
  char *endp;
  char cVar43;
  ulong uVar44;
  bool bVar45;
  uint p0;
  char *local_98;
  ulong local_78;
  
  rar = (rar *)a->format->data;
  paVar19 = rar->opt_sconv;
  if (paVar19 == (archive_string_conv *)0x0) {
    if (rar->init_default_conversion == 0) {
      paVar19 = archive_string_default_conversion_for_read((archive_conflict *)a);
      rar->sconv_default = paVar19;
      rar->init_default_conversion = 1;
    }
    paVar19 = rar->sconv_default;
  }
  psVar20 = (short *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (psVar20 == (short *)0x0) {
    return -0x1e;
  }
  sVar9 = *psVar20;
  uVar8 = *(ushort *)((long)psVar20 + 5);
  uVar44 = (ulong)uVar8;
  rar->file_flags = (uint)*(ushort *)((long)psVar20 + 3);
  if (uVar8 < 0x20) {
    pcVar34 = "Invalid header size";
  }
  else {
    uVar15 = crc32(0,psVar20 + 1,5);
    __archive_read_consume(a,7);
    if ((rar->file_flags & 0x10) == 0) {
      rar->compression_method = '\0';
      rar->packed_size = 0;
      rar->unp_size = 0;
      rar->mtime = 0;
      rar->mnsec = 0;
      rar->mode = 0;
      rar->salt[0] = '\0';
      rar->salt[1] = '\0';
      rar->salt[2] = '\0';
      rar->salt[3] = '\0';
      rar->salt[4] = '\0';
      rar->salt[5] = '\0';
      rar->salt[6] = '\0';
      rar->salt[7] = '\0';
      rar->atime = 0;
      rar->ansec = 0;
      rar->ctime = 0;
      rar->cnsec = 0;
      rar->arctime = 0;
      rar->arcnsec = 0;
      puVar21 = (uint *)__archive_read_ahead(a,uVar44 - 7,(ssize_t *)0x0);
      if (puVar21 == (uint *)0x0) {
        return -0x1e;
      }
      sVar14 = crc32(uVar15,puVar21,uVar44 - 7 & 0xffffffff);
      if (sVar9 == sVar14) {
        uVar32 = *puVar21;
        uVar42 = puVar21[1];
        uVar23 = (ulong)uVar42;
        uVar12 = puVar21[2];
        bVar39 = *(byte *)((long)puVar21 + 0x13);
        uVar41 = puVar21[5];
        bVar4 = *(byte *)((long)puVar21 + 0x15);
        bVar5 = *(byte *)((long)puVar21 + 0x16);
        bVar6 = *(byte *)((long)puVar21 + 0x17);
        uVar13 = puVar21[6];
        iVar16 = *(int *)((long)puVar21 + 0xd);
        uVar10 = *(uint *)((long)puVar21 + 9);
        rar->compression_method = *(char *)((long)puVar21 + 0x12);
        tVar22 = get_time(iVar16);
        rar->mtime = tVar22;
        rar->file_crc = (ulong)uVar10;
        if ((rar->file_flags & 4) != 0) {
          archive_entry_set_is_data_encrypted(entry,'\x01');
          rar->has_encrypted_entries = 1;
          archive_set_error(&a->archive,0x54,"RAR encryption support unavailable.");
        }
        piVar1 = &rar->packed_size;
        if ((rar->file_flags & 0x100) == 0) {
          pcVar34 = (char *)((long)puVar21 + 0x19);
          *piVar1 = (ulong)uVar32;
LAB_00247c7d:
          rar->unp_size = uVar23;
          lVar38 = rar->packed_size;
          if ((lVar38 < 0) || ((long)uVar23 < 0)) {
            pcVar34 = "Invalid sizes specified.";
          }
          else {
            lVar2 = uVar44 + (long)puVar21;
            rar->bytes_remaining = lVar38;
            uVar23 = uVar44;
            if (head_type == 'z') {
              uVar23 = lVar38 + uVar44;
              pvVar24 = __archive_read_ahead(a,(lVar38 + uVar44) - 7,(ssize_t *)0x0);
              pcVar34 = (char *)(((long)pcVar34 - (long)puVar21) + (long)pvVar24);
              lVar2 = (long)pvVar24 + uVar23;
              if (pvVar24 == (void *)0x0) {
                return -0x1e;
              }
            }
            endp = (char *)(lVar2 + -7);
            __n = (ulong)(byte)uVar41 * 0x100 + (ulong)bVar39;
            local_98 = pcVar34 + __n;
            if (local_98 <= endp) {
              uVar32 = (uint)__n;
              uVar44 = (ulong)(uVar32 * 2 + 2);
              if (rar->filename_allocated < uVar44) {
                pcVar25 = (char *)realloc(rar->filename,uVar44);
                if (pcVar25 != (char *)0x0) {
                  rar->filename = pcVar25;
                  rar->filename_allocated = uVar44;
                  goto LAB_00247d60;
                }
                goto LAB_00247ed9;
              }
LAB_00247d60:
              psVar20 = (short *)rar->filename;
              memcpy(psVar20,pcVar34,__n);
              *(undefined1 *)((long)psVar20 + __n) = 0;
              if ((rar->file_flags & 0x200) == 0) {
                while (pcVar34 = strchr((char *)psVar20,0x5c), paVar27 = paVar19,
                      pcVar34 != (char *)0x0) {
                  *pcVar34 = '/';
                }
              }
              else {
                sVar26 = strlen((char *)psVar20);
                if (sVar26 == __n) {
                  if (rar->sconv_utf8 == (archive_string_conv *)0x0) {
                    paVar27 = archive_string_conversion_from_charset
                                        ((archive_conflict *)a,"UTF-8",L'\x01');
                    rar->sconv_utf8 = paVar27;
                    if (paVar27 == (archive_string_conv *)0x0) {
                      return -0x1e;
                    }
                  }
                  paVar27 = rar->sconv_utf8;
                  while (pcVar34 = strchr((char *)psVar20,0x5c), pcVar34 != (char *)0x0) {
                    *pcVar34 = '/';
                  }
                }
                else {
                  uVar42 = (int)sVar26 + 1;
                  sVar37 = 0;
                  if (uVar42 < uVar32) {
                    cVar43 = pcVar34[uVar42];
                    uVar42 = (int)sVar26 + 2;
                  }
                  else {
                    cVar43 = '\0';
                  }
                  uVar10 = uVar32 * 2;
                  if (uVar42 < uVar32) {
                    bVar45 = __n != 0;
                    bVar39 = 0;
                    bVar31 = 0;
                    sVar37 = 0;
LAB_00247f3d:
                    sVar26 = (size_t)uVar42;
LAB_00247f40:
                    uVar41 = (uint)sVar26;
                    if (bVar31 == 0) {
                      uVar41 = uVar41 + 1;
                      bVar39 = pcVar34[sVar26];
                      bVar31 = 8;
                    }
                    bVar31 = bVar31 - 2;
                    uVar36 = (uint)sVar37;
                    switch(bVar39 >> (bVar31 & 0x1f) & 3) {
                    case 0:
                      if (uVar32 <= uVar41) {
LAB_00247f87:
                        sVar26 = (size_t)uVar41;
                        goto LAB_00247f8a;
                      }
                      *(undefined1 *)((long)psVar20 + sVar37) = 0;
                      break;
                    case 1:
                      if (uVar32 <= uVar41) goto LAB_00247f87;
                      *(char *)((long)psVar20 + sVar37) = cVar43;
                      break;
                    case 2:
                      sVar26 = __n;
                      if (uVar32 - 1 <= uVar41) goto LAB_00247f8a;
                      *(char *)((long)psVar20 + sVar37) = pcVar34[(ulong)uVar41 + 1];
                      sVar37 = (size_t)(uVar36 + 2);
                      *(char *)((long)psVar20 + (long)(int)uVar36 + 1) = pcVar34[uVar41];
                      uVar42 = uVar41 + 2;
                      goto LAB_002480be;
                    case 3:
                      uVar42 = uVar41;
                      if (uVar32 <= uVar41) goto LAB_002480be;
                      bVar7 = pcVar34[uVar41];
                      local_78 = (ulong)uVar41 + 1;
                      uVar42 = (uint)local_78;
                      if ((char)bVar7 < '\0') {
                        if (uVar32 <= uVar42) goto LAB_002480be;
                        cVar40 = pcVar34[local_78];
                        local_78 = (ulong)(uVar41 + 2);
                        cVar35 = cVar43;
                      }
                      else {
                        cVar40 = '\0';
                        cVar35 = '\0';
                      }
                      if (uVar10 <= uVar36) goto LAB_002480a7;
                      uVar44 = (ulong)(int)uVar36;
                      lVar38 = 0;
                      goto LAB_00248079;
                    }
                    uVar42 = uVar41 + 1;
                    sVar37 = (size_t)(uVar36 + 2);
                    *(char *)((long)psVar20 + (long)(int)uVar36 + 1) = pcVar34[uVar41];
                    goto LAB_002480be;
                  }
LAB_002480db:
                  if (uVar10 < (uint)sVar37) {
                    paVar27 = (archive_string_conv *)0x54;
                    archive_set_error(&a->archive,0x54,"Invalid filename");
                    __n = sVar37;
LAB_002480fd:
                    bVar45 = false;
                  }
                  else {
                    __n = (size_t)((uint)sVar37 + 1);
                    *(undefined2 *)((long)psVar20 + sVar37) = 0;
                    if (rar->sconv_utf16be == (archive_string_conv *)0x0) {
                      paVar27 = (archive_string_conv *)0x2a30d4;
                      paVar29 = archive_string_conversion_from_charset
                                          ((archive_conflict *)a,"UTF-16BE",L'\x01');
                      rar->sconv_utf16be = paVar29;
                      if (paVar29 == (archive_string_conv *)0x0) goto LAB_002480fd;
                    }
                    paVar27 = rar->sconv_utf16be;
                    sVar9 = *psVar20;
                    psVar11 = psVar20;
                    while (sVar9 != 0) {
                      if (*psVar11 == 0x5c00) {
                        *(undefined1 *)((long)psVar11 + 1) = 0x2f;
                      }
                      sVar9 = psVar11[1];
                      psVar11 = psVar11 + 1;
                    }
                    pcVar34 = pcVar34 + uVar42;
                    bVar45 = true;
                  }
                  local_98 = pcVar34;
                  if (!bVar45) {
                    return -0x1e;
                  }
                }
              }
              pcVar34 = rar->filename_save;
              if (((pcVar34 != (char *)0x0) && (rar->filename_save_size == __n)) &&
                 (iVar16 = bcmp(rar->filename,pcVar34,(ulong)((int)__n + 1)), iVar16 == 0)) {
                __archive_read_consume(a,uVar23 - 7);
                uVar32 = rar->cursor + 1;
                rar->cursor = uVar32;
                if (rar->nodes <= uVar32) {
                  pdVar28 = (data_block_offsets *)realloc(rar->dbo,(ulong)(rar->nodes + 1) * 0x18);
                  if (pdVar28 == (data_block_offsets *)0x0) {
                    archive_set_error(&a->archive,0xc,"Couldn\'t allocate memory.");
                    return -0x1e;
                  }
                  rar->dbo = pdVar28;
                  rar->nodes = rar->nodes + 1;
                  uVar32 = rar->cursor;
                  pdVar28[uVar32].header_size = uVar23;
                  piVar3 = &pdVar28[uVar32].start_offset;
                  *(undefined4 *)piVar3 = 0xffffffff;
                  *(undefined4 *)((long)piVar3 + 4) = 0xffffffff;
                  *(undefined4 *)(piVar3 + 1) = 0xffffffff;
                  *(undefined4 *)((long)piVar3 + 0xc) = 0xffffffff;
                }
                pdVar28 = rar->dbo;
                uVar32 = rar->cursor;
                if (-1 < pdVar28[uVar32].start_offset) {
                  return 0;
                }
                pdVar28[uVar32].start_offset = a->filter->position;
                pdVar28[uVar32].end_offset = *piVar1 + pdVar28[uVar32].start_offset;
                return 0;
              }
              if (rar->filename_must_match != '\0') {
                pcVar34 = "Mismatch of file parts split across multi-volume archive";
                goto LAB_00247bdf;
              }
              uVar44 = (ulong)((int)__n + 1);
              pcVar34 = (char *)realloc(pcVar34,uVar44);
              if (pcVar34 == (char *)0x0) {
LAB_00247ed9:
                pcVar34 = "Couldn\'t allocate memory.";
              }
              else {
                rar->filename_save = pcVar34;
                memcpy(pcVar34,rar->filename,uVar44);
                rar->filename_save_size = __n;
                free(rar->dbo);
                pdVar28 = (data_block_offsets *)calloc(1,0x18);
                rar->dbo = pdVar28;
                if (pdVar28 == (data_block_offsets *)0x0) goto LAB_00247ed9;
                pdVar28->header_size = uVar23;
                *(undefined4 *)&pdVar28->start_offset = 0xffffffff;
                *(undefined4 *)((long)&pdVar28->start_offset + 4) = 0xffffffff;
                *(undefined4 *)&pdVar28->end_offset = 0xffffffff;
                *(undefined4 *)((long)&pdVar28->end_offset + 4) = 0xffffffff;
                rar->cursor = 0;
                rar->nodes = 1;
                if ((rar->file_flags & 0x400) != 0) {
                  if (endp < local_98 + 8) goto LAB_00247c19;
                  *(undefined8 *)rar->salt = *(undefined8 *)local_98;
                  local_98 = local_98 + 8;
                }
                if (((rar->file_flags & 0x1000) != 0) &&
                   (iVar16 = read_exttime(local_98,rar,endp), iVar16 < 0)) {
                  pcVar34 = "Invalid header size";
                  goto LAB_00247bdf;
                }
                __archive_read_consume(a,uVar23 - 7);
                lVar38 = a->filter->position;
                pdVar28 = rar->dbo;
                pdVar28->start_offset = lVar38;
                pdVar28->end_offset = lVar38 + rar->packed_size;
                if ((byte)uVar12 - 3 < 3) {
                  mVar33 = (uint)bVar5 * 0x100 + (uint)bVar4 | (uint)bVar6 << 0x10 |
                           (uint)(byte)uVar13 << 0x18;
                }
                else {
                  if (2 < (byte)uVar12) {
                    pcVar34 = "Unknown file attributes from RAR file\'s host OS";
                    goto LAB_00247bdf;
                  }
                  uVar32 = 0x4049;
                  if ((bVar4 & 0x10) == 0) {
                    uVar32 = 0x8000;
                  }
                  rar->mode = uVar32;
                  mVar33 = uVar32 | 0x1a4;
                }
                rar->mode = mVar33;
                rar->bytes_unconsumed = 0;
                (rar->lzss).position = 0;
                rar->dictionary_size = 0;
                (rar->br).cache_avail = 0;
                (rar->br).avail_in = 0;
                rar->crc_calculated = 0;
                rar->entry_eof = '\0';
                rar->bytes_uncopied = 0;
                rar->offset = 0;
                rar->offset_outgoing = 0;
                rar->offset_seek = 0;
                rar->valid = '\x01';
                rar->is_ppmd_block = '\0';
                rar->start_new_table = '\x01';
                free(rar->unp_buffer);
                rar->unp_buffer = (uchar *)0x0;
                rar->unp_offset = 0;
                rar->unp_buffer_size = 0x20000;
                memset(rar->lengthtable,0,0x194);
                Ppmd7_Free(&rar->ppmd7_context);
                rar->ppmd_valid = '\0';
                rar->ppmd_eod = '\0';
                (rar->filters).filterstart = 0x7fffffffffffffff;
                if (head_type == 'z') {
                  return 0;
                }
                archive_entry_set_mtime(entry,rar->mtime,rar->mnsec);
                archive_entry_set_ctime(entry,rar->ctime,rar->cnsec);
                archive_entry_set_atime(entry,rar->atime,rar->ansec);
                archive_entry_set_size(entry,rar->unp_size);
                archive_entry_set_mode(entry,rar->mode);
                wVar17 = _archive_entry_copy_pathname_l(entry,(char *)psVar20,__n,paVar27);
                if (wVar17 == L'\0') {
                  iVar16 = 0;
LAB_002484f9:
                  iVar18 = iVar16;
                  if ((rar->mode & 0xf000) == 0xa000) {
                    rar->bytes_remaining = 0;
                    archive_entry_set_size(entry,0);
                    iVar18 = read_symlink_stored(a,entry,paVar19);
                    if (iVar18 < -0x14) {
                      return iVar18;
                    }
                    if (iVar16 < iVar18) {
                      iVar18 = iVar16;
                    }
                  }
                  if (rar->bytes_remaining != 0) {
                    return iVar18;
                  }
                  rar->entry_eof = '\x01';
                  return iVar18;
                }
                piVar30 = __errno_location();
                if (*piVar30 != 0xc) {
                  pcVar34 = archive_string_conversion_charset_name(paVar27);
                  archive_set_error(&a->archive,0x54,
                                    "Pathname cannot be converted from %s to current locale.",
                                    pcVar34);
                  iVar16 = -0x14;
                  goto LAB_002484f9;
                }
                pcVar34 = "Can\'t allocate memory for Pathname";
              }
              iVar16 = 0xc;
              goto LAB_00247be4;
            }
            pcVar34 = "Invalid filename size";
          }
        }
        else {
          if (0x27 < uVar8) {
            pcVar34 = (char *)((long)puVar21 + 0x21);
            uVar15 = *(undefined4 *)((long)puVar21 + 0x1d);
            *piVar1 = (ulong)(uVar32 & 0xff00) |
                      CONCAT44(*(undefined4 *)((long)puVar21 + 0x19),uVar32) & 0xffffffffffff0000 |
                      (ulong)uVar32 & 0xff;
            uVar23 = (ulong)(uVar42 & 0xff00) | CONCAT44(uVar15,uVar42) & 0xffffffffffff0000 |
                     uVar23 & 0xff;
            goto LAB_00247c7d;
          }
LAB_00247c19:
          pcVar34 = "Invalid header size";
        }
      }
      else {
        pcVar34 = "Header CRC error";
      }
    }
    else {
      pcVar34 = "RAR solid archive support unavailable.";
    }
  }
LAB_00247bdf:
  iVar16 = 0x54;
LAB_00247be4:
  archive_set_error(&a->archive,iVar16,pcVar34);
  return -0x1e;
  while (lVar38 = lVar38 + 1, uVar42 < uVar10) {
LAB_00248079:
    *(char *)((long)psVar20 + lVar38 * 2 + uVar44) = cVar35;
    *(char *)((long)psVar20 + lVar38 * 2 + uVar44 + 1) =
         pcVar34[(int)(uVar44 >> 1) + (int)lVar38 & 0x7fffffff] + cVar40;
    uVar42 = (int)sVar37 + 2;
    sVar37 = (size_t)uVar42;
    if ((byte)((bVar7 & 0x7f) + 1) == (char)lVar38) break;
  }
LAB_002480a7:
  uVar42 = (uint)local_78;
LAB_002480be:
  bVar45 = (uint)sVar37 < uVar10;
  if ((uVar32 <= uVar42) || (uVar10 <= (uint)sVar37)) goto LAB_002480db;
  goto LAB_00247f3d;
LAB_00247f8a:
  uVar42 = (uint)sVar26;
  if (!(bool)(uVar42 < uVar32 & bVar45)) goto LAB_002480db;
  goto LAB_00247f40;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry,
				&use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}